

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_String remove_extra_quotes(Am_String *filename)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  Am_String *in_RSI;
  int local_28;
  int i;
  int len;
  char *s;
  Am_String *filename_local;
  
  __s = Am_String::operator_cast_to_char_(in_RSI);
  if (*__s == '\"') {
    sVar2 = strlen(__s);
    iVar1 = (int)sVar2;
    for (local_28 = 1; local_28 < iVar1 + -1; local_28 = local_28 + 1) {
      __s[local_28 + -1] = __s[local_28];
    }
    __s[iVar1 + -2] = __s[iVar1];
    Am_String::operator=(in_RSI,__s);
  }
  Am_String::Am_String(filename,in_RSI);
  return (Am_String)(Am_String_Data *)filename;
}

Assistant:

Am_String
remove_extra_quotes(Am_String filename)
{
  char *s = filename;
  if (s[0] == '\"') {
    int len = strlen(s);
    for (int i = 1; i < len - 1; i++)
      s[i - 1] = s[i];
    s[len - 2] = s[len];
    filename = s;
  }
  return filename;
}